

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O3

void __thiscall sznet::detail::ThreadData::runInThread(ThreadData *this)

{
  char *pcVar1;
  int *in_FS_OFFSET;
  
  sznet::CurrentThread::t_cachedTid::__tls_init();
  if (*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  sznet::CurrentThread::t_cachedTid::__tls_init();
  *this->m_tid = *in_FS_OFFSET;
  this->m_tid = (sz_pid_t *)0x0;
  CountDownLatch::countDown(this->m_latch);
  this->m_latch = (CountDownLatch *)0x0;
  if ((this->m_name)._M_string_length == 0) {
    pcVar1 = "sznetThread";
  }
  else {
    pcVar1 = (this->m_name)._M_dataplus._M_p;
  }
  sznet::CurrentThread::t_threadName::__tls_init();
  *(char **)in_FS_OFFSET = pcVar1;
  if ((this->m_func).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->m_func)._M_invoker)((_Any_data *)this);
  sznet::CurrentThread::t_threadName::__tls_init();
  *(char **)in_FS_OFFSET = "finished";
  return;
}

Assistant:

void runInThread()
	{
		// 获得该线程的tid，没有缓存就重新获取再缓存
		*m_tid = sznet::CurrentThread::tid();
		m_tid = nullptr;
		// -1，唤醒
		m_latch->countDown();
		m_latch = nullptr;

		sznet::CurrentThread::t_threadName = m_name.empty() ? "sznetThread" : m_name.c_str();
		try
		{
			m_func();
			sznet::CurrentThread::t_threadName = "finished";
		}
		catch (const Exception& ex)
		{
			sznet::CurrentThread::t_threadName = "crashed";
			fprintf(stderr, "exception caught in Thread %s\n", m_name.c_str());
			fprintf(stderr, "reason: %s\n", ex.what());
			fprintf(stderr, "stack trace: %s\n", ex.stackTrace());
			abort();
		}
		catch (const std::exception& ex)
		{
			sznet::CurrentThread::t_threadName = "crashed";
			fprintf(stderr, "exception caught in Thread %s\n", m_name.c_str());
			fprintf(stderr, "reason: %s\n", ex.what());
			abort();
		}
		catch (...)
		{
			sznet::CurrentThread::t_threadName = "crashed";
			fprintf(stderr, "unknown exception caught in Thread %s\n", m_name.c_str());
			// re throw
			throw;
		}
	}